

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpegls.cpp
# Opt level: O1

golomb_code_table *
charls::anon_unknown_82::initialize_table(golomb_code_table *__return_storage_ptr__,int32_t k)

{
  byte bVar1;
  int iVar2;
  byte bVar3;
  golomb_code c;
  golomb_code c_00;
  uint uVar4;
  uint uVar5;
  uint32_t uVar6;
  short sVar7;
  
  uVar4 = 0;
  memset(__return_storage_ptr__,0,0x800);
  bVar3 = (byte)k;
  uVar5 = k + 1;
  bVar1 = (byte)(1 << (bVar3 & 0x1f));
  if (uVar5 < 9) {
    sVar7 = 1;
    iVar2 = 0;
    uVar6 = uVar5;
    do {
      c.length_ = uVar6;
      c.value_ = iVar2;
      golomb_code_table::add_entry(__return_storage_ptr__,(byte)uVar4 & bVar1 - 1 | bVar1,c);
      iVar2 = (int)sVar7;
      uVar4 = iVar2 * 2 ^ iVar2 >> 0x1e;
      uVar6 = ((int)uVar4 >> (bVar3 & 0x1f)) + uVar5;
      sVar7 = sVar7 + 1;
    } while (uVar6 < 9);
  }
  uVar6 = (1U >> (bVar3 & 0x1f)) + uVar5;
  if (uVar6 < 9) {
    iVar2 = -1;
    uVar4 = 1;
    sVar7 = -2;
    do {
      c_00.length_ = uVar6;
      c_00.value_ = iVar2;
      golomb_code_table::add_entry(__return_storage_ptr__,(byte)uVar4 & bVar1 - 1 | bVar1,c_00);
      iVar2 = (int)sVar7;
      uVar4 = iVar2 * 2 ^ iVar2 >> 0x1e;
      uVar6 = ((int)uVar4 >> (bVar3 & 0x1f)) + uVar5;
      sVar7 = sVar7 + -1;
    } while (uVar6 < 9);
  }
  return __return_storage_ptr__;
}

Assistant:

golomb_code_table initialize_table(const int32_t k) noexcept
{
    golomb_code_table table;
    for (int16_t error_value{};; ++error_value)
    {
        // Q is not used when k != 0
        const int32_t mapped_error_value{map_error_value(error_value)};
        const std::pair<int32_t, int32_t> pair_code{create_encoded_value(k, mapped_error_value)};
        if (static_cast<size_t>(pair_code.first) > golomb_code_table::byte_bit_count)
            break;

        const golomb_code code(error_value, conditional_static_cast<int16_t>(pair_code.first));
        table.add_entry(static_cast<uint8_t>(pair_code.second), code);
    }

    for (int16_t error_value{-1};; --error_value)
    {
        // Q is not used when k != 0
        const int32_t mapped_error_value{map_error_value(error_value)};
        const std::pair<int32_t, int32_t> pair_code{create_encoded_value(k, mapped_error_value)};
        if (static_cast<size_t>(pair_code.first) > golomb_code_table::byte_bit_count)
            break;

        const auto code{golomb_code(error_value, static_cast<int16_t>(pair_code.first))};
        table.add_entry(static_cast<uint8_t>(pair_code.second), code);
    }

    return table;
}